

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

bool Catch::replaceInPlace(string *str,string *replaceThis,string *withThis)

{
  undefined8 *puVar1;
  ulong uVar2;
  long *plVar3;
  undefined8 *puVar4;
  ulong *puVar5;
  ulong uVar6;
  undefined1 *local_c0 [2];
  undefined1 local_b0 [16];
  ulong *local_a0;
  long local_98;
  ulong local_90 [2];
  ulong *local_80;
  long local_78;
  ulong local_70;
  long lStack_68;
  string *local_60;
  ulong local_58;
  undefined8 *local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  local_60 = withThis;
  uVar2 = std::__cxx11::string::find((char *)str,(ulong)(replaceThis->_M_dataplus)._M_p,0);
  local_58 = uVar2;
  if (uVar2 != 0xffffffffffffffff) {
    do {
      std::__cxx11::string::substr((ulong)local_c0,(ulong)str);
      plVar3 = (long *)std::__cxx11::string::_M_append
                                 ((char *)local_c0,(ulong)(local_60->_M_dataplus)._M_p);
      puVar5 = (ulong *)(plVar3 + 2);
      if ((ulong *)*plVar3 == puVar5) {
        local_70 = *puVar5;
        lStack_68 = plVar3[3];
        local_80 = &local_70;
      }
      else {
        local_70 = *puVar5;
        local_80 = (ulong *)*plVar3;
      }
      local_78 = plVar3[1];
      *plVar3 = (long)puVar5;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      std::__cxx11::string::substr((ulong)&local_a0,(ulong)str);
      uVar6 = 0xf;
      if (local_80 != &local_70) {
        uVar6 = local_70;
      }
      if (uVar6 < (ulong)(local_98 + local_78)) {
        uVar6 = 0xf;
        if (local_a0 != local_90) {
          uVar6 = local_90[0];
        }
        if (uVar6 < (ulong)(local_98 + local_78)) goto LAB_001335c9;
        puVar4 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_a0,0,(char *)0x0,(ulong)local_80);
      }
      else {
LAB_001335c9:
        puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_80,(ulong)local_a0);
      }
      local_50 = &local_40;
      puVar1 = puVar4 + 2;
      if ((undefined8 *)*puVar4 == puVar1) {
        local_40 = *puVar1;
        uStack_38 = puVar4[3];
      }
      else {
        local_40 = *puVar1;
        local_50 = (undefined8 *)*puVar4;
      }
      local_48 = puVar4[1];
      *puVar4 = puVar1;
      puVar4[1] = 0;
      *(undefined1 *)puVar1 = 0;
      std::__cxx11::string::operator=((string *)str,(string *)&local_50);
      if (local_50 != &local_40) {
        operator_delete(local_50);
      }
      if (local_a0 != local_90) {
        operator_delete(local_a0);
      }
      if (local_80 != &local_70) {
        operator_delete(local_80);
      }
      if (local_c0[0] != local_b0) {
        operator_delete(local_c0[0]);
      }
      if (str->_M_string_length - local_60->_M_string_length <= uVar2) break;
      uVar2 = std::__cxx11::string::find
                        ((char *)str,(ulong)(replaceThis->_M_dataplus)._M_p,
                         local_60->_M_string_length + uVar2);
    } while (uVar2 != 0xffffffffffffffff);
  }
  return local_58 != 0xffffffffffffffff;
}

Assistant:

bool replaceInPlace(std::string& str, std::string const& replaceThis, std::string const& withThis) {
		bool replaced = false;
		std::size_t i = str.find(replaceThis);
		while (i != std::string::npos) {
			replaced = true;
			str = str.substr(0, i) + withThis + str.substr(i + replaceThis.size());
			if (i < str.size() - withThis.size())
				i = str.find(replaceThis, i + withThis.size());
			else
				i = std::string::npos;
		}
		return replaced;
	}